

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear-algebra.cc
# Opt level: O3

point3d * tinyusdz::vnormalize(point3d *a,double eps)

{
  double dVar1;
  undefined1 auVar2 [16];
  point3d *in_RDI;
  undefined1 auVar3 [16];
  double dVar4;
  
  dVar1 = a->z;
  auVar3._0_8_ = a->x;
  auVar3._8_8_ = a->y;
  dVar4 = dVar1 * dVar1 +
          (double)auVar3._0_8_ * (double)auVar3._0_8_ + (double)auVar3._8_8_ * (double)auVar3._8_8_;
  dVar4 = (double)(-(ulong)(2.220446049250313e-16 < dVar4) & (ulong)SQRT(dVar4));
  if (dVar4 <= eps) {
    dVar4 = eps;
  }
  auVar2._8_8_ = dVar4;
  auVar2._0_8_ = dVar4;
  auVar3 = divpd(auVar3,auVar2);
  in_RDI->x = (double)auVar3._0_8_;
  in_RDI->y = (double)auVar3._8_8_;
  in_RDI->z = dVar1 / dVar4;
  return in_RDI;
}

Assistant:

value::point3d vnormalize(const value::point3d &a, const double eps) {
  double len = vlength(a);
  len = (len > eps) ? len : eps;
  return value::point3d({a[0] / len, a[1] / len, a[2] / len});
}